

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

bool google::protobuf::io::Tokenizer::ParseInteger(string *text,uint64 max_value,uint64 *output)

{
  int iVar1;
  ulong uStack_40;
  int digit;
  uint64 result;
  char *pcStack_30;
  int base;
  char *ptr;
  uint64 *output_local;
  uint64 max_value_local;
  string *text_local;
  
  pcStack_30 = (char *)std::__cxx11::string::c_str();
  result._4_4_ = 10;
  if (*pcStack_30 == '0') {
    if ((pcStack_30[1] == 'x') || (pcStack_30[1] == 'X')) {
      result._4_4_ = 0x10;
      pcStack_30 = pcStack_30 + 2;
    }
    else {
      result._4_4_ = 8;
    }
  }
  uStack_40 = 0;
  while( true ) {
    if (*pcStack_30 == '\0') {
      *output = uStack_40;
      return true;
    }
    iVar1 = anon_unknown_4::DigitValue(*pcStack_30);
    if ((iVar1 < 0) || (result._4_4_ <= iVar1)) break;
    if ((max_value < (ulong)(long)iVar1) ||
       ((max_value - (long)iVar1) / (ulong)(long)result._4_4_ < uStack_40)) {
      return false;
    }
    uStack_40 = uStack_40 * (long)result._4_4_ + (long)iVar1;
    pcStack_30 = pcStack_30 + 1;
  }
  return false;
}

Assistant:

bool Tokenizer::ParseInteger(const string& text, uint64 max_value,
                             uint64* output) {
  // Sadly, we can't just use strtoul() since it is only 32-bit and strtoull()
  // is non-standard.  I hate the C standard library.  :(

//  return strtoull(text.c_str(), NULL, 0);

  const char* ptr = text.c_str();
  int base = 10;
  if (ptr[0] == '0') {
    if (ptr[1] == 'x' || ptr[1] == 'X') {
      // This is hex.
      base = 16;
      ptr += 2;
    } else {
      // This is octal.
      base = 8;
    }
  }

  uint64 result = 0;
  for (; *ptr != '\0'; ptr++) {
    int digit = DigitValue(*ptr);
    if (digit < 0 || digit >= base) {
      // The token provided by Tokenizer is invalid. i.e., 099 is an invalid
      // token, but Tokenizer still think it's integer.
      return false;
    }
    if (digit > max_value || result > (max_value - digit) / base) {
      // Overflow.
      return false;
    }
    result = result * base + digit;
  }

  *output = result;
  return true;
}